

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

InverseDistanceWeighting * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_inversedistanceweighting
          (KNearestNeighborsClassifier *this)

{
  InverseDistanceWeighting *this_00;
  
  if (this->_oneof_case_[2] == 0xd2) {
    this_00 = (InverseDistanceWeighting *)(this->WeightingScheme_).uniformweighting_;
  }
  else {
    clear_WeightingScheme(this);
    this->_oneof_case_[2] = 0xd2;
    this_00 = (InverseDistanceWeighting *)operator_new(0x18);
    InverseDistanceWeighting::InverseDistanceWeighting(this_00);
    (this->WeightingScheme_).inversedistanceweighting_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::InverseDistanceWeighting* KNearestNeighborsClassifier::mutable_inversedistanceweighting() {
  if (!has_inversedistanceweighting()) {
    clear_WeightingScheme();
    set_has_inversedistanceweighting();
    WeightingScheme_.inversedistanceweighting_ = new ::CoreML::Specification::InverseDistanceWeighting;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.inverseDistanceWeighting)
  return WeightingScheme_.inversedistanceweighting_;
}